

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<QString,QAnyStringView>
                    (QList<QString> *vector,QAnyStringView *u,qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  QAnyStringView *in_RDX;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  QAnyStringView *in_stack_ffffffffffffff68;
  QAnyStringView *in_stack_ffffffffffffff70;
  QAnyStringView *in_stack_ffffffffffffff80;
  QAnyStringView *local_70;
  qsizetype local_58;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = in_RDX;
  if ((long)in_RDX < 0) {
    qVar2 = QList<QString>::size(in_RDI);
    local_10 = (long)&in_RDX->field_0 + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    local_70 = (QAnyStringView *)*plVar3;
    in_stack_ffffffffffffff80 = in_RDX;
  }
  qVar2 = QList<QString>::size(in_RDI);
  if ((long)local_70 < qVar2) {
    local_20.i = (QString *)0xaaaaaaaaaaaaaaaa;
    QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffff70);
    QList<QString>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    local_20 = QList<QString>::const_iterator::operator-
                         ((const_iterator *)in_stack_ffffffffffffff70,
                          (qsizetype)in_stack_ffffffffffffff68);
    cVar4 = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffff70);
    do {
      this = QList<QString>::const_iterator::operator++(&local_20);
      bVar1 = QList<QString>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_00275542;
      QList<QString>::const_iterator::operator*(&local_20);
      QAnyStringView::QAnyStringView(in_stack_ffffffffffffff80,(QString *)local_70);
      bVar1 = ::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    } while (!bVar1);
    cVar4 = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffff70);
    local_58 = QList<QString>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_00275542:
    local_58 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}